

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplatformprintdevice.cpp
# Opt level: O1

QPlatformPrintDevice * __thiscall
QPlatformPrintDevice::supportedPageSizeMatch(QPlatformPrintDevice *this,QPageSize *pageSize)

{
  qsizetype qVar1;
  long lVar2;
  long lVar3;
  QPageSize *in_RDX;
  long lVar4;
  QPageSize *pQVar5;
  bool bVar6;
  
  qVar1 = QtPrivate::indexOf<QPageSize,QPageSize>((QList<QPageSize> *)(pageSize + 0x70),in_RDX,0);
  if (qVar1 == -1) {
    lVar4 = *(long *)(pageSize + 0x80);
    bVar6 = lVar4 == 0;
    if (!bVar6) {
      pQVar5 = *(QPageSize **)(pageSize + 0x78);
      lVar2 = QPageSize::sizePoints();
      lVar3 = QPageSize::sizePoints();
      if (lVar2 != lVar3) {
        lVar4 = lVar4 * 8;
        do {
          lVar4 = lVar4 + -8;
          bVar6 = lVar4 == 0;
          if (bVar6) goto LAB_0012c808;
          pQVar5 = pQVar5 + 8;
          lVar2 = QPageSize::sizePoints();
          lVar3 = QPageSize::sizePoints();
        } while (lVar2 != lVar3);
      }
      QPageSize::QPageSize((QPageSize *)this,pQVar5);
      if (!bVar6) {
        return this;
      }
    }
LAB_0012c808:
    QPageSize::QPageSize((QPageSize *)this);
  }
  else {
    QPageSize::QPageSize((QPageSize *)this,in_RDX);
  }
  return this;
}

Assistant:

QPageSize QPlatformPrintDevice::supportedPageSizeMatch(const QPageSize &pageSize) const
{
    // If it's a known page size, just return itself
    if (m_pageSizes.contains(pageSize))
        return pageSize;

    // Try to find a supported page size based on point size
    for (const QPageSize &ps : std::as_const(m_pageSizes)) {
        if (ps.sizePoints() == pageSize.sizePoints())
            return ps;
    }
    return QPageSize();
}